

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

void Dar_LibCreateData(Dar_Lib_t *p,int nDatas)

{
  Dar_LibDat_t *__s;
  
  if (p->nDatas == nDatas) {
    return;
  }
  if (p->pDatas != (Dar_LibDat_t *)0x0) {
    free(p->pDatas);
    p->pDatas = (Dar_LibDat_t *)0x0;
  }
  p->nDatas = nDatas;
  __s = (Dar_LibDat_t *)malloc((long)nDatas * 0x18);
  p->pDatas = __s;
  memset(__s,0,(long)nDatas * 0x18);
  return;
}

Assistant:

void Dar_LibCreateData( Dar_Lib_t * p, int nDatas )
{
    if ( p->nDatas == nDatas )
        return;
    ABC_FREE( p->pDatas );
    // allocate datas
    p->nDatas = nDatas;
    p->pDatas = ABC_ALLOC( Dar_LibDat_t, nDatas );
    memset( p->pDatas, 0, sizeof(Dar_LibDat_t) * nDatas );
}